

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.hpp
# Opt level: O2

string * __thiscall de::toString<char_const*>(string *__return_storage_ptr__,de *this,char **value)

{
  ostringstream s;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,*(char **)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString (const T& value)
{
	std::ostringstream s;
	s << value;
	return s.str();
}